

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O1

void __thiscall QSaveFilePrivate::~QSaveFilePrivate(QSaveFilePrivate *this)

{
  Data *pDVar1;
  
  (this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.
  _vptr_QObjectData = (_func_int **)&PTR__QSaveFilePrivate_006a87e0;
  pDVar1 = (this->finalFileName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->finalFileName).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->fileName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->fileName).d.d)->super_QArrayData,2,0x10);
    }
  }
  QFileDevicePrivate::~QFileDevicePrivate(&this->super_QFileDevicePrivate);
  return;
}

Assistant:

QSaveFilePrivate::~QSaveFilePrivate()
{
}